

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDVertex::SharpEdgeCount
          (ON_SubDVertex *this,bool bCountCreasesAsSharp,bool bEndCheck,ON_Interval *sharpness_range
          )

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  ON_SubDEdge *this_00;
  ulong uVar7;
  double dVar8;
  double local_58;
  double local_50;
  double local_40;
  
  pOVar2 = this->m_edges;
  uVar6 = 0;
  local_50 = 0.0;
  if (pOVar2 == (ON_SubDEdgePtr *)0x0) {
    local_58 = 0.0;
  }
  else {
    uVar1 = this->m_edge_count;
    local_58 = 0.0;
    uVar6 = 0;
    if ((ulong)uVar1 != 0) {
      local_40 = 5.0;
      uVar7 = 0;
      uVar6 = 0;
      local_58 = 0.0;
      local_50 = 0.0;
      do {
        this_00 = (ON_SubDEdge *)(pOVar2[uVar7].m_ptr & 0xfffffffffffffff8);
        if ((this_00 != (ON_SubDEdge *)0x0) && (this_00->m_face_count == 2)) {
          bVar5 = ON_SubDEdge::IsSharp(this_00);
          if (bVar5) {
            dVar8 = local_40;
            if (this_00->m_edge_tag != Crease) {
              dVar8 = ON_SubDEdge::EndSharpness(this_00,this);
            }
          }
          else if ((!bCountCreasesAsSharp) || (dVar8 = 5.0, this_00->m_edge_tag != Crease))
          goto LAB_005ca17c;
          if ((!bEndCheck) || (0.0 < dVar8)) {
            dVar3 = dVar8;
            dVar4 = dVar8;
            if ((uVar6 != 0) &&
               ((dVar4 = local_50, local_58 <= dVar8 && (dVar3 = local_58, local_50 < dVar8)))) {
              dVar4 = dVar8;
            }
            local_50 = dVar4;
            local_58 = dVar3;
            uVar6 = uVar6 + 1;
          }
        }
LAB_005ca17c:
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  ON_Interval::Set(sharpness_range,local_58,local_50);
  return uVar6;
}

Assistant:

unsigned int ON_SubDVertex::SharpEdgeCount(
  bool bCountCreasesAsSharp,
  bool bEndCheck,
  ON_Interval& sharpness_range
) const
{
  unsigned int sharp_edge_count = 0;
  double mins = 0.0;
  double maxs = 0.0;
  if (nullptr != m_edges)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 2 != e->m_face_count)
        continue;
      if (false == e->IsSharp())
      {
        if (false == bCountCreasesAsSharp || false == e->IsCrease())
          continue;
      }
      const double s = e->IsCrease() ? ON_SubDEdgeSharpness::CreaseValue : e->EndSharpness(this);
      if (false == bEndCheck || s > 0.0)
      {
        if (0 == sharp_edge_count)
        {
          mins = s;
          maxs = s;
        }
        else if (s < mins)
          mins = s;
        else if (s > maxs)
          maxs = s;
        ++sharp_edge_count;
      }
    }
  }
  sharpness_range.Set(mins, maxs);
  return sharp_edge_count;
}